

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O0

bool LoadNodes(FileReader *lump)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  gl5_mapnode_t *pgVar7;
  mapnode_t *pmVar8;
  ulong uVar9;
  long lVar10;
  undefined8 uStack_100;
  undefined1 auStack_f8 [32];
  gl5_mapnode_t *local_d8;
  ulong local_d0;
  FileReader *local_c8;
  gl5_mapnode_t *local_c0;
  int *local_b8;
  mapnode_t *local_b0;
  mapnode_t *local_a8;
  mapnode_t *local_a0;
  mapnode_t *local_98;
  ulong local_90;
  FileReader *local_88;
  mapnode_t *local_80;
  int *local_78;
  uint local_6c;
  gl5_mapnode_t *pgStack_68;
  SDWORD child_1;
  gl5_mapnode_t *basemn_1;
  gl5_mapnode_t *mn_1;
  mapnode_t *pmStack_50;
  WORD child;
  mapnode_t *basemn;
  mapnode_t *mn;
  WORD *used;
  node_t *no;
  int local_28;
  int k;
  int j;
  int i;
  int GL5_NF_SUBSECTOR;
  int NF_SUBSECTOR;
  FileReader *lump_local;
  
  i = 0x8000;
  j = -0x80000000;
  _GL5_NF_SUBSECTOR = lump;
  if (format5) {
    uStack_100 = 0x5635c2;
    uVar9 = FileReader::GetLength(lump);
    numnodes = (int)(uVar9 >> 5);
    if (numnodes == 0) {
      return false;
    }
    local_b8 = &numnodes;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (long)numnodes;
    uVar9 = SUB168(auVar5 * ZEXT816(0x48),0);
    local_d0 = 0xffffffffffffffff;
    if (SUB168(auVar5 * ZEXT816(0x48),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    uStack_100 = 0x563619;
    nodes = (node_t *)operator_new__(uVar9);
    uStack_100 = 0x563637;
    (*(_GL5_NF_SUBSECTOR->super_FileReaderBase)._vptr_FileReaderBase[4])(_GL5_NF_SUBSECTOR,0);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)*local_b8;
    uVar9 = SUB168(auVar6 * ZEXT816(0x20),0);
    if (SUB168(auVar6 * ZEXT816(0x20),8) != 0) {
      uVar9 = local_d0;
    }
    uStack_100 = 0x56365c;
    local_c0 = (gl5_mapnode_t *)operator_new__(uVar9);
    local_c8 = _GL5_NF_SUBSECTOR;
    uStack_100 = 0x56367f;
    pgStack_68 = local_c0;
    basemn_1 = local_c0;
    lVar10 = FileReader::GetLength(_GL5_NF_SUBSECTOR);
    uStack_100 = 0x563699;
    (*(local_c8->super_FileReaderBase)._vptr_FileReaderBase[2])(local_c8,local_c0,lVar10);
    lVar10 = -((long)*local_b8 * 2 + 0xfU & 0xfffffffffffffff0);
    mn = (mapnode_t *)(auStack_f8 + lVar10);
    *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x5636d1;
    memset((mapnode_t *)(auStack_f8 + lVar10),0,(long)numnodes << 1);
    pgVar7 = pgStack_68;
    used = (WORD *)nodes;
    for (k = 0; k < numnodes; k = k + 1) {
      *(int *)used = (int)basemn_1->x << 0x10;
      *(int *)(used + 2) = (int)basemn_1->y << 0x10;
      *(int *)(used + 4) = (int)basemn_1->dx << 0x10;
      *(int *)(used + 6) = (int)basemn_1->dy << 0x10;
      for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
        local_6c = basemn_1->children[local_28];
        if ((local_6c & 0x80000000) == 0) {
          if (numnodes <= (int)local_6c) {
            auStack_f8._24_8_ = pgStack_68;
            if (pgStack_68 != (gl5_mapnode_t *)0x0) {
              *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x563800;
              operator_delete__(pgVar7);
            }
            return false;
          }
          if ((&((mapnode_t *)(mn->bbox + -1))->x)[(int)local_6c] != 0) {
            auStack_f8._16_8_ = pgStack_68;
            if (pgStack_68 != (gl5_mapnode_t *)0x0) {
              *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x563835;
              operator_delete__(pgVar7);
            }
            return false;
          }
          *(node_t **)(used + (long)local_28 * 4 + 0x1c) = nodes + (int)local_6c;
          (&((mapnode_t *)(mn->bbox + -1))->x)[(int)local_6c] = (short)local_28 + 1;
        }
        else {
          local_6c = local_6c & 0x7fffffff;
          if (numsubsectors <= (int)local_6c) {
            local_d8 = pgStack_68;
            if (pgStack_68 != (gl5_mapnode_t *)0x0) {
              *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x5637a1;
              operator_delete__(pgVar7);
            }
            return false;
          }
          *(undefined1 **)(used + (long)local_28 * 4 + 0x1c) =
               (undefined1 *)((long)&subsectors[(int)local_6c].sector + 1);
        }
        for (no._4_4_ = 0; no._4_4_ < 4; no._4_4_ = no._4_4_ + 1) {
          *(float *)(used + (long)local_28 * 8 + (long)no._4_4_ * 2 + 8) =
               (float)(int)basemn_1->bbox[local_28][no._4_4_];
        }
      }
      used = used + 0x24;
      basemn_1 = basemn_1 + 1;
    }
    auStack_f8._8_8_ = pgStack_68;
    if (pgStack_68 != (gl5_mapnode_t *)0x0) {
      *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x56391b;
      operator_delete__(pgVar7);
    }
  }
  else {
    uStack_100 = 0x563263;
    uVar9 = FileReader::GetLength(lump);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar9;
    numnodes = SUB164(auVar2 / ZEXT816(0x1c),0);
    if (numnodes == 0) {
      return false;
    }
    local_78 = &numnodes;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)numnodes;
    uVar9 = SUB168(auVar3 * ZEXT816(0x48),0);
    local_90 = 0xffffffffffffffff;
    if (SUB168(auVar3 * ZEXT816(0x48),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    uStack_100 = 0x5632bd;
    nodes = (node_t *)operator_new__(uVar9);
    uStack_100 = 0x5632db;
    (*(_GL5_NF_SUBSECTOR->super_FileReaderBase)._vptr_FileReaderBase[4])(_GL5_NF_SUBSECTOR,0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)*local_78;
    uVar9 = SUB168(auVar4 * ZEXT816(0x1c),0);
    if (SUB168(auVar4 * ZEXT816(0x1c),8) != 0) {
      uVar9 = local_90;
    }
    uStack_100 = 0x5632fd;
    local_80 = (mapnode_t *)operator_new__(uVar9);
    local_88 = _GL5_NF_SUBSECTOR;
    uStack_100 = 0x56331a;
    pmStack_50 = local_80;
    basemn = local_80;
    lVar10 = FileReader::GetLength(_GL5_NF_SUBSECTOR);
    uStack_100 = 0x56332e;
    (*(local_88->super_FileReaderBase)._vptr_FileReaderBase[2])(local_88,local_80,lVar10);
    lVar10 = -((long)*local_78 * 2 + 0xfU & 0xfffffffffffffff0);
    mn = (mapnode_t *)(auStack_f8 + lVar10);
    *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x563363;
    memset((mapnode_t *)(auStack_f8 + lVar10),0,(long)numnodes << 1);
    pmVar8 = pmStack_50;
    used = (WORD *)nodes;
    for (k = 0; k < numnodes; k = k + 1) {
      *(int *)used = (int)basemn->x << 0x10;
      *(int *)(used + 2) = (int)basemn->y << 0x10;
      *(int *)(used + 4) = (int)basemn->dx << 0x10;
      *(int *)(used + 6) = (int)basemn->dy << 0x10;
      for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
        uVar1 = basemn->children[local_28];
        if ((uVar1 & 0x8000) == 0) {
          mn_1._6_2_ = uVar1;
          if (numnodes <= (int)(uint)uVar1) {
            local_a0 = pmStack_50;
            if (pmStack_50 != (mapnode_t *)0x0) {
              *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x563499;
              operator_delete__(pmVar8);
            }
            return false;
          }
          if ((&((mapnode_t *)(mn->bbox + -1))->x)[uVar1] != 0) {
            local_a8 = pmStack_50;
            if (pmStack_50 != (mapnode_t *)0x0) {
              *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x5634ce;
              operator_delete__(pmVar8);
            }
            return false;
          }
          *(node_t **)(used + (long)local_28 * 4 + 0x1c) = nodes + uVar1;
          (&((mapnode_t *)(mn->bbox + -1))->x)[uVar1] = (short)local_28 + 1;
        }
        else {
          mn_1._6_2_ = uVar1 & 0x7fff;
          if (numsubsectors <= (int)(uint)mn_1._6_2_) {
            local_98 = pmStack_50;
            if (pmStack_50 != (mapnode_t *)0x0) {
              *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x563439;
              operator_delete__(pmVar8);
            }
            return false;
          }
          *(undefined1 **)(used + (long)local_28 * 4 + 0x1c) =
               (undefined1 *)((long)&subsectors[mn_1._6_2_].sector + 1);
        }
        for (no._4_4_ = 0; no._4_4_ < 4; no._4_4_ = no._4_4_ + 1) {
          *(float *)(used + (long)local_28 * 8 + (long)no._4_4_ * 2 + 8) =
               (float)(int)basemn->bbox[local_28][no._4_4_];
        }
      }
      used = used + 0x24;
      basemn = basemn + 1;
    }
    local_b0 = pmStack_50;
    if (pmStack_50 != (mapnode_t *)0x0) {
      *(undefined8 *)(auStack_f8 + lVar10 + -8) = 0x5635b4;
      operator_delete__(pmVar8);
    }
  }
  return true;
}

Assistant:

static bool LoadNodes (FileReader * lump)
{
	const int NF_SUBSECTOR = 0x8000;
	const int GL5_NF_SUBSECTOR = (1 << 31);

	int 		i;
	int 		j;
	int 		k;
	node_t* 	no;
	WORD*		used;

	if (!format5)
	{
		mapnode_t*	mn, * basemn;
		numnodes = lump->GetLength() / sizeof(mapnode_t);

		if (numnodes == 0) return false;

		nodes = new node_t[numnodes];		
		lump->Seek(0, SEEK_SET);

		basemn = mn = new mapnode_t[numnodes];
		lump->Read(mn, lump->GetLength());

		used = (WORD *)alloca (sizeof(WORD)*numnodes);
		memset (used, 0, sizeof(WORD)*numnodes);

		no = nodes;

		for (i = 0; i < numnodes; i++, no++, mn++)
		{
			no->x = LittleShort(mn->x)<<FRACBITS;
			no->y = LittleShort(mn->y)<<FRACBITS;
			no->dx = LittleShort(mn->dx)<<FRACBITS;
			no->dy = LittleShort(mn->dy)<<FRACBITS;
			for (j = 0; j < 2; j++)
			{
				WORD child = LittleShort(mn->children[j]);
				if (child & NF_SUBSECTOR)
				{
					child &= ~NF_SUBSECTOR;
					if (child >= numsubsectors)
					{
						delete [] basemn;
						return false;
					}
					no->children[j] = (BYTE *)&subsectors[child] + 1;
				}
				else if (child >= numnodes)
				{
					delete [] basemn;
					return false;
				}
				else if (used[child])
				{
					delete [] basemn;
					return false;
				}
				else
				{
					no->children[j] = &nodes[child];
					used[child] = j + 1;
				}
				for (k = 0; k < 4; k++)
				{
					no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
				}
			}
		}
		delete [] basemn;
	}
	else
	{
		gl5_mapnode_t*	mn, * basemn;
		numnodes = lump->GetLength() / sizeof(gl5_mapnode_t);

		if (numnodes == 0) return false;

		nodes = new node_t[numnodes];		
		lump->Seek(0, SEEK_SET);

		basemn = mn = new gl5_mapnode_t[numnodes];
		lump->Read(mn, lump->GetLength());

		used = (WORD *)alloca (sizeof(WORD)*numnodes);
		memset (used, 0, sizeof(WORD)*numnodes);

		no = nodes;

		for (i = 0; i < numnodes; i++, no++, mn++)
		{
			no->x = LittleShort(mn->x)<<FRACBITS;
			no->y = LittleShort(mn->y)<<FRACBITS;
			no->dx = LittleShort(mn->dx)<<FRACBITS;
			no->dy = LittleShort(mn->dy)<<FRACBITS;
			for (j = 0; j < 2; j++)
			{
				SDWORD child = LittleLong(mn->children[j]);
				if (child & GL5_NF_SUBSECTOR)
				{
					child &= ~GL5_NF_SUBSECTOR;
					if (child >= numsubsectors)
					{
						delete [] basemn;
						return false;
					}
					no->children[j] = (BYTE *)&subsectors[child] + 1;
				}
				else if (child >= numnodes)
				{
					delete [] basemn;
					return false;
				}
				else if (used[child])
				{
					delete [] basemn;
					return false;
				}
				else
				{
					no->children[j] = &nodes[child];
					used[child] = j + 1;
				}
				for (k = 0; k < 4; k++)
				{
					no->bbox[j][k] = (float)LittleShort(mn->bbox[j][k]);
				}
			}
		}
		delete [] basemn;
	}
	return true;
}